

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O2

void __thiscall ScalarEstimator::setProperty(ScalarEstimator *this,Property *p,double d)

{
  double *pdVar1;
  ulong uVar2;
  int iVar3;
  double dVar4;
  
  iVar3 = *p;
  if (iVar3 == 3) {
    if (0.0 < d) {
      this->nDist = (int)d;
    }
    if (this->aDist != (double *)0x0) {
      operator_delete__(this->aDist);
    }
    iVar3 = this->nDist;
    uVar2 = 0xffffffffffffffff;
    if (-1 < (long)iVar3) {
      uVar2 = (long)iVar3 * 8;
    }
    pdVar1 = (double *)operator_new__(uVar2);
    this->aDist = pdVar1;
    d = this->aDistRange[0];
    dVar4 = this->aDistRange[1];
    this->dDistOffset = d;
  }
  else {
    if (iVar3 == 2) {
      this->aDistRange[1] = d;
      if (this->aDist != (double *)0x0) {
        operator_delete__(this->aDist);
        d = this->aDistRange[1];
      }
      iVar3 = this->nDist;
      uVar2 = 0xffffffffffffffff;
      if (-1 < (long)iVar3) {
        uVar2 = (long)iVar3 * 8;
      }
      pdVar1 = (double *)operator_new__(uVar2);
      this->aDist = pdVar1;
      this->dDistOffset = this->aDistRange[0];
      dVar4 = d - this->aDistRange[0];
      goto LAB_0013d1c9;
    }
    if (iVar3 != 1) {
      return;
    }
    this->aDistRange[0] = d;
    if (this->aDist != (double *)0x0) {
      operator_delete__(this->aDist);
      d = this->aDistRange[0];
    }
    iVar3 = this->nDist;
    uVar2 = 0xffffffffffffffff;
    if (-1 < (long)iVar3) {
      uVar2 = (long)iVar3 * 8;
    }
    pdVar1 = (double *)operator_new__(uVar2);
    this->aDist = pdVar1;
    this->dDistOffset = d;
    dVar4 = this->aDistRange[1];
  }
  dVar4 = dVar4 - d;
LAB_0013d1c9:
  this->dDistScale = dVar4 / (double)iVar3;
  return;
}

Assistant:

void ScalarEstimator::setProperty(const Property& p, double d)
{
	if( p == EST_DIST_MIN ) {
		aDistRange[0] = d;
		delete[] aDist;
		aDist = new double[nDist];
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	} else if ( p == EST_DIST_MAX ) {
		aDistRange[1] = d;
		delete[] aDist;
		aDist = new double[nDist];
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	} else if ( p == EST_DIST_BINS ) {
		if( d>0 )
			nDist = (int) d;
		delete[] aDist;
		aDist = new double[nDist];
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	}
}